

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

void ssh1_got_user_input(ConnectionLayer *cl)

{
  size_t sVar1;
  bool bVar2;
  undefined1 local_28 [8];
  ptrlen data;
  ssh1_connection_state *s;
  ConnectionLayer *cl_local;
  
  while( true ) {
    bVar2 = false;
    if (cl[-0xb].vt != (ConnectionLayerVtable *)0x0) {
      sVar1 = bufchain_size((bufchain *)cl[-9].vt);
      bVar2 = sVar1 != 0;
    }
    if (!bVar2) break;
    _local_28 = bufchain_prefix((bufchain *)cl[-9].vt);
    if ((void *)0x200 < data.ptr) {
      data.ptr = (void *)0x200;
    }
    sshfwd_write((SshChannel *)(cl + -0xc),(void *)local_28,(size_t)data.ptr);
    bufchain_consume((bufchain *)cl[-9].vt,(size_t)data.ptr);
  }
  return;
}

Assistant:

static void ssh1_got_user_input(ConnectionLayer *cl)
{
    struct ssh1_connection_state *s =
        container_of(cl, struct ssh1_connection_state, cl);

    while (s->mainchan && bufchain_size(s->user_input) > 0) {
        /*
         * Add user input to the main channel's buffer.
         */
        ptrlen data = bufchain_prefix(s->user_input);
        if (data.len > 512)
            data.len = 512;
        sshfwd_write(&s->mainchan_sc, data.ptr, data.len);
        bufchain_consume(s->user_input, data.len);
    }
}